

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void DoOneIntegrationTest
               (List<MiniScript::String> *sourceLines,long sourceLineNum,
               List<MiniScript::String> *expectedOutput,long outputLineNum)

{
  StringStorage *pSVar1;
  size_t sVar2;
  size_t sVar3;
  ListStorage<MiniScript::String> *pLVar4;
  StringStorage *pSVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  long *plVar8;
  StringStorage *pSVar9;
  char *pcVar10;
  undefined1 auVar11 [8];
  long lVar12;
  String *pSVar13;
  unsigned_long uVar14;
  ulong uVar15;
  String *s;
  size_t sVar16;
  unsigned_long uVar17;
  long lVar18;
  Interpreter miniscript;
  StringStorage *local_138;
  char local_130;
  String local_128;
  size_t local_118;
  List<MiniScript::String> *local_110;
  long local_108;
  String local_100;
  String local_f0;
  long *local_e0;
  char local_d8;
  String local_d0;
  List<MiniScript::String> local_c0;
  unsigned_long local_b0;
  String local_a8;
  String local_98;
  undefined1 local_88 [8];
  code *local_80;
  code *local_78;
  code *local_70;
  String local_40;
  
  local_110 = expectedOutput;
  MiniScript::List<MiniScript::String>::Clear(&testOutput);
  local_c0.isTemp = false;
  local_c0.ls = sourceLines->ls;
  if (local_c0.ls == (ListStorage<MiniScript::String> *)0x0) {
    local_c0.ls = (ListStorage<MiniScript::String> *)operator_new(0x30);
    ((local_c0.ls)->super_RefCountedStorage).refCount = 1;
    ((local_c0.ls)->super_SimpleVector<MiniScript::String>).mBlockItems = 0;
    ((local_c0.ls)->super_SimpleVector<MiniScript::String>).mBuf = (String *)0x0;
    ((local_c0.ls)->super_SimpleVector<MiniScript::String>).mQtyItems = 0;
    ((local_c0.ls)->super_SimpleVector<MiniScript::String>).mBufItems = 0;
    ((local_c0.ls)->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__ListStorage_001bf1a0;
    sourceLines->ls = local_c0.ls;
    lVar12 = 2;
  }
  else {
    lVar12 = ((local_c0.ls)->super_RefCountedStorage).refCount + 1;
  }
  ((local_c0.ls)->super_RefCountedStorage).refCount = lVar12;
  MiniScript::Interpreter::Interpreter((Interpreter *)local_88,&local_c0);
  if ((local_c0.ls != (ListStorage<MiniScript::String> *)0x0) && (local_c0.isTemp == false)) {
    plVar8 = &((local_c0.ls)->super_RefCountedStorage).refCount;
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      (*((local_c0.ls)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      local_c0.ls = (ListStorage<MiniScript::String> *)0x0;
    }
  }
  local_80 = PrintToTestOutput;
  local_70 = PrintToTestOutput;
  local_78 = PrintToTestOutput;
  MiniScript::Interpreter::RunUntilDone((Interpreter *)local_88,60.0,false);
  MiniScript::Interpreter::~Interpreter((Interpreter *)local_88);
  lVar12 = *(long *)sourceLineNum;
  if (lVar12 == 0) {
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) goto LAB_0010ee25;
LAB_0010eacb:
    if (lVar12 != 0) goto LAB_0010ead0;
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) goto LAB_0010ee25;
    bVar7 = true;
    lVar12 = 0;
    lVar18 = 0;
LAB_0010eb06:
    uVar14 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
    if ((long)uVar14 < lVar18) {
LAB_0010eb13:
      MiniScript::String::Format((String *)local_88,(long)&local_110->ls + uVar14,"%ld");
      MiniScript::operator+
                ((MiniScript *)&local_f0,"TEST FAILED: MISSING OUTPUT AT LINE ",(String *)local_88);
      Print(&local_f0,true);
      if ((local_f0.ss != (StringStorage *)0x0) && (local_f0.isTemp == false)) {
        plVar8 = &((local_f0.ss)->super_RefCountedStorage).refCount;
        *plVar8 = *plVar8 + -1;
        if (*plVar8 == 0) {
          (*((local_f0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_f0.ss = (StringStorage *)0x0;
      }
      if ((local_88 != (undefined1  [8])0x0) && (local_80._0_1_ == false)) {
        plVar8 = &((RefCountedStorage *)local_88)->refCount;
        *plVar8 = *plVar8 + -1;
        if (*plVar8 == 0) {
          (*((RefCountedStorage *)local_88)->_vptr_RefCountedStorage[1])();
        }
      }
      if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
        uVar14 = 0;
      }
      else {
        uVar14 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
      }
      lVar12 = uVar14 << 4;
      do {
        lVar18 = *(long *)sourceLineNum;
        if (lVar18 == 0) {
          if (-1 < (long)uVar14) goto LAB_0010ee25;
          MiniScript::_Error("Assert failed: ls",
                             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                             ,0x3b);
          lVar18 = *(long *)sourceLineNum;
LAB_0010ece3:
          MiniScript::_Error("invalid index in SimpleVector::operator[]",
                             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                             ,0xc1);
          pSVar13 = *(String **)(lVar18 + 0x18);
        }
        else {
          if (*(long *)(lVar18 + 0x20) <= (long)uVar14) goto LAB_0010ee25;
          if ((long)uVar14 < 0) goto LAB_0010ece3;
          pSVar13 = (String *)(*(long *)(lVar18 + 0x18) + lVar12);
        }
        MiniScript::operator+((MiniScript *)&local_98,"  MISSING: ",pSVar13);
        Print(&local_98,true);
        if ((local_98.ss != (StringStorage *)0x0) && (local_98.isTemp == false)) {
          plVar8 = &((local_98.ss)->super_RefCountedStorage).refCount;
          *plVar8 = *plVar8 + -1;
          if (*plVar8 == 0) {
            (*((local_98.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_98.ss = (StringStorage *)0x0;
        }
        uVar14 = uVar14 + 1;
        lVar12 = lVar12 + 0x10;
      } while( true );
    }
    if (bVar7) {
      if (0 < (long)uVar14) {
        lVar12 = 0;
        goto LAB_0010ebd2;
      }
      goto LAB_0010ee25;
    }
  }
  else {
    if (testOutput.ls != (ListStorage<MiniScript::String> *)0x0) {
      uVar14 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
      if (*(long *)(lVar12 + 0x20) < (long)uVar14) {
        uVar14 = *(unsigned_long *)(lVar12 + 0x20);
      }
      if (0 < (long)uVar14) {
        lVar12 = 0;
        uVar17 = 0;
        local_b0 = uVar14;
        do {
          if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
            MiniScript::_Error("Assert failed: ls",
                               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                               ,0x3b);
          }
          pLVar4 = testOutput.ls;
          if ((long)uVar17 <
              (long)((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems) {
            pSVar13 = (String *)
                      ((long)&(((testOutput.ls)->super_SimpleVector<MiniScript::String>).mBuf)->ss +
                      lVar12);
          }
          else {
            MiniScript::_Error("invalid index in SimpleVector::operator[]",
                               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                               ,0xc1);
            pSVar13 = (pLVar4->super_SimpleVector<MiniScript::String>).mBuf;
          }
          lVar18 = *(long *)sourceLineNum;
          if (lVar18 == 0) {
            MiniScript::_Error("Assert failed: ls",
                               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                               ,0x3b);
            lVar18 = *(long *)sourceLineNum;
          }
          if ((long)uVar17 < *(long *)(lVar18 + 0x20)) {
            s = (String *)(*(long *)(lVar18 + 0x18) + lVar12);
          }
          else {
            MiniScript::_Error("invalid index in SimpleVector::operator[]",
                               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                               ,0xc1);
            s = *(String **)(lVar18 + 0x18);
          }
          bVar7 = MiniScript::String::operator!=(pSVar13,s);
          if (bVar7) {
            MiniScript::String::Format(&local_40,(long)&local_110->ls + uVar17,"%ld");
            MiniScript::operator+((MiniScript *)&local_e0,"TEST FAILED AT LINE ",&local_40);
            MiniScript::String::operator+(&local_128,(char *)&local_e0);
            lVar18 = *(long *)sourceLineNum;
            if (lVar18 == 0) {
              MiniScript::_Error("Assert failed: ls",
                                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                                 ,0x3b);
              lVar18 = *(long *)sourceLineNum;
            }
            if ((long)uVar17 < *(long *)(lVar18 + 0x20)) {
              plVar8 = (long *)(*(long *)(lVar18 + 0x18) + lVar12);
            }
            else {
              MiniScript::_Error("invalid index in SimpleVector::operator[]",
                                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                                 ,0xc1);
              plVar8 = *(long **)(lVar18 + 0x18);
            }
            pSVar5 = local_128.ss;
            pSVar1 = (StringStorage *)*plVar8;
            if (pSVar1 == (StringStorage *)0x0) {
              local_138 = local_128.ss;
              if (local_128.ss != (StringStorage *)0x0) {
                plVar8 = &((local_128.ss)->super_RefCountedStorage).refCount;
                *plVar8 = *plVar8 + 1;
              }
            }
            else if (local_128.ss == (StringStorage *)0x0) {
              plVar8 = &(pSVar1->super_RefCountedStorage).refCount;
              *plVar8 = *plVar8 + 1;
              local_138 = pSVar1;
            }
            else {
              sVar2 = (local_128.ss)->dataSize;
              sVar16 = pSVar1->dataSize;
              pSVar9 = (StringStorage *)operator_new(0x30);
              uVar15 = sVar16 + (sVar2 - 1);
              (pSVar9->super_RefCountedStorage).refCount = 1;
              (pSVar9->super_RefCountedStorage)._vptr_RefCountedStorage =
                   (_func_int **)&PTR__StringStorage_001bf0d8;
              pSVar9->dataSize = uVar15;
              pSVar9->charCount = -1;
              local_118 = sVar16;
              local_108 = lVar12;
              pcVar10 = (char *)operator_new__(uVar15);
              sVar16 = sVar2 - 1;
              pSVar9->data = pcVar10;
              memset(pcVar10,0,uVar15);
              memcpy(pcVar10,pSVar5->data,sVar16);
              memcpy(pcVar10 + sVar16,pSVar1->data,local_118);
              lVar12 = local_108;
              uVar14 = local_b0;
              local_138 = pSVar9;
            }
            local_130 = '\0';
            MiniScript::String::operator+((String *)local_88,(char *)&local_138);
            if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
              MiniScript::_Error("Assert failed: ls",
                                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                                 ,0x3b);
            }
            pLVar4 = testOutput.ls;
            if ((long)uVar17 <
                (long)((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems) {
              pSVar13 = (String *)
                        ((long)&(((testOutput.ls)->super_SimpleVector<MiniScript::String>).mBuf)->ss
                        + lVar12);
            }
            else {
              MiniScript::_Error("invalid index in SimpleVector::operator[]",
                                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                                 ,0xc1);
              pSVar13 = (pLVar4->super_SimpleVector<MiniScript::String>).mBuf;
            }
            auVar6 = local_88;
            pSVar1 = pSVar13->ss;
            if (pSVar1 == (StringStorage *)0x0) {
              local_d0.ss = (StringStorage *)local_88;
              auVar11 = local_88;
              if (local_88 != (undefined1  [8])0x0) goto LAB_0010e9aa;
              auVar11 = (undefined1  [8])0x0;
            }
            else {
              auVar11 = (undefined1  [8])pSVar1;
              if (local_88 == (undefined1  [8])0x0) {
LAB_0010e9aa:
                plVar8 = &(((StringStorage *)auVar11)->super_RefCountedStorage).refCount;
                *plVar8 = *plVar8 + 1;
                local_d0.ss = (StringStorage *)auVar11;
              }
              else {
                sVar2 = *(size_t *)((long)local_88 + 0x18);
                sVar3 = pSVar1->dataSize;
                auVar11 = (undefined1  [8])operator_new(0x30);
                uVar15 = (sVar3 + sVar2) - 1;
                (((StringStorage *)auVar11)->super_RefCountedStorage).refCount = 1;
                (((StringStorage *)auVar11)->super_RefCountedStorage)._vptr_RefCountedStorage =
                     (_func_int **)&PTR__StringStorage_001bf0d8;
                ((StringStorage *)auVar11)->dataSize = uVar15;
                ((StringStorage *)auVar11)->charCount = -1;
                local_118 = sVar3;
                local_108 = lVar12;
                pcVar10 = (char *)operator_new__(uVar15);
                sVar16 = sVar2 - 1;
                ((StringStorage *)auVar11)->data = pcVar10;
                memset(pcVar10,0,uVar15);
                memcpy(pcVar10,*(char **)((long)auVar6 + 0x10),sVar16);
                memcpy(pcVar10 + sVar16,pSVar1->data,local_118);
                lVar12 = local_108;
                uVar14 = local_b0;
                local_d0.ss = (StringStorage *)auVar11;
              }
            }
            local_d0.isTemp = false;
            Print(&local_d0,true);
            if (auVar11 != (undefined1  [8])0x0) {
              plVar8 = &(((StringStorage *)auVar11)->super_RefCountedStorage).refCount;
              *plVar8 = *plVar8 + -1;
              if (*plVar8 == 0) {
                (*(((StringStorage *)auVar11)->super_RefCountedStorage)._vptr_RefCountedStorage[1])
                          (auVar11);
              }
              local_d0.ss = (StringStorage *)0x0;
            }
            if ((local_88 != (undefined1  [8])0x0) && (local_80._0_1_ == false)) {
              plVar8 = &((RefCountedStorage *)local_88)->refCount;
              *plVar8 = *plVar8 + -1;
              if (*plVar8 == 0) {
                (*((RefCountedStorage *)local_88)->_vptr_RefCountedStorage[1])();
              }
              local_88 = (undefined1  [8])0x0;
            }
            if ((local_138 != (StringStorage *)0x0) && (local_130 == '\0')) {
              plVar8 = &(local_138->super_RefCountedStorage).refCount;
              *plVar8 = *plVar8 + -1;
              if (*plVar8 == 0) {
                (*(local_138->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
              }
              local_138 = (StringStorage *)0x0;
            }
            if ((local_128.ss != (StringStorage *)0x0) && (local_128.isTemp == false)) {
              plVar8 = &((local_128.ss)->super_RefCountedStorage).refCount;
              *plVar8 = *plVar8 + -1;
              if (*plVar8 == 0) {
                (*((local_128.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
              }
              local_128.ss = (StringStorage *)0x0;
            }
            if ((local_e0 != (long *)0x0) && (local_d8 == '\0')) {
              plVar8 = local_e0 + 1;
              *plVar8 = *plVar8 + -1;
              if (*plVar8 == 0) {
                (**(code **)(*local_e0 + 8))();
              }
              local_e0 = (long *)0x0;
            }
            if ((local_40.ss != (StringStorage *)0x0) && (local_40.isTemp == false)) {
              plVar8 = &((local_40.ss)->super_RefCountedStorage).refCount;
              *plVar8 = *plVar8 + -1;
              if (*plVar8 == 0) {
                (*((local_40.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
              }
            }
          }
          uVar17 = uVar17 + 1;
          lVar12 = lVar12 + 0x10;
        } while (uVar14 != uVar17);
        lVar12 = *(long *)sourceLineNum;
        goto LAB_0010eacb;
      }
    }
LAB_0010ead0:
    lVar18 = *(long *)(lVar12 + 0x20);
    if (testOutput.ls != (ListStorage<MiniScript::String> *)0x0) {
      bVar7 = false;
      goto LAB_0010eb06;
    }
    uVar14 = 0;
    if (0 < lVar18) goto LAB_0010eb13;
  }
  lVar12 = *(long *)(lVar12 + 0x20);
  if (lVar12 < (long)uVar14) {
LAB_0010ebd2:
    MiniScript::String::Format((String *)local_88,(long)&local_110->ls + lVar12,"%ld");
    MiniScript::operator+
              ((MiniScript *)&local_100,"TEST FAILED: EXTRA OUTPUT AT LINE ",(String *)local_88);
    Print(&local_100,true);
    if ((local_100.ss != (StringStorage *)0x0) && (local_100.isTemp == false)) {
      plVar8 = &((local_100.ss)->super_RefCountedStorage).refCount;
      *plVar8 = *plVar8 + -1;
      if (*plVar8 == 0) {
        (*((local_100.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_100.ss = (StringStorage *)0x0;
    }
    if ((local_88 != (undefined1  [8])0x0) && (local_80._0_1_ == false)) {
      plVar8 = &((RefCountedStorage *)local_88)->refCount;
      *plVar8 = *plVar8 + -1;
      if (*plVar8 == 0) {
        (*((RefCountedStorage *)local_88)->_vptr_RefCountedStorage[1])();
      }
    }
    if (*(long *)sourceLineNum == 0) {
      lVar12 = 0;
    }
    else {
      lVar12 = *(long *)(*(long *)sourceLineNum + 0x20);
    }
    lVar18 = lVar12 << 4;
    do {
      if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
        if (-1 < lVar12) break;
        MiniScript::_Error("Assert failed: ls",
                           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                           ,0x3b);
LAB_0010edba:
        pLVar4 = testOutput.ls;
        MiniScript::_Error("invalid index in SimpleVector::operator[]",
                           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                           ,0xc1);
        pSVar13 = (pLVar4->super_SimpleVector<MiniScript::String>).mBuf;
      }
      else {
        if ((long)((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems <= lVar12)
        break;
        if (lVar12 < 0) goto LAB_0010edba;
        pSVar13 = (String *)
                  ((long)&(((testOutput.ls)->super_SimpleVector<MiniScript::String>).mBuf)->ss +
                  lVar18);
      }
      MiniScript::operator+((MiniScript *)&local_a8,"  EXTRA: ",pSVar13);
      Print(&local_a8,true);
      if ((local_a8.ss != (StringStorage *)0x0) && (local_a8.isTemp == false)) {
        plVar8 = &((local_a8.ss)->super_RefCountedStorage).refCount;
        *plVar8 = *plVar8 + -1;
        if (*plVar8 == 0) {
          (*((local_a8.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_a8.ss = (StringStorage *)0x0;
      }
      lVar12 = lVar12 + 1;
      lVar18 = lVar18 + 0x10;
    } while( true );
  }
LAB_0010ee25:
  MiniScript::List<MiniScript::String>::Clear(&testOutput);
  return;
}

Assistant:

static void DoOneIntegrationTest(List<String> sourceLines, long sourceLineNum,
				 List<String> expectedOutput, long outputLineNum) {
//	std::cout << "Running test starting at line " << sourceLineNum << std::endl;
	
	testOutput.Clear();
	{
		Interpreter miniscript(sourceLines);
		miniscript.standardOutput = &PrintToTestOutput;
		miniscript.errorOutput = &PrintToTestOutput;
		miniscript.implicitOutput = &PrintToTestOutput;
		miniscript.RunUntilDone(60, false);
	}
	
	long minLen = expectedOutput.Count() < testOutput.Count() ? expectedOutput.Count() : testOutput.Count();
	for (long i = 0; i < minLen; i++) {
		if (testOutput[i] != expectedOutput[i]) {
			Print("TEST FAILED AT LINE " + String::Format(outputLineNum + i)
			+ "\n  EXPECTED: " + expectedOutput[i]
			+ "\n    ACTUAL: " + testOutput[i]);
		}
	}
	if (expectedOutput.Count() > testOutput.Count()) {
		Print("TEST FAILED: MISSING OUTPUT AT LINE " + String::Format(outputLineNum + testOutput.Count()));
		for (long i = testOutput.Count(); i < expectedOutput.Count(); i++) {
			Print("  MISSING: " + expectedOutput[i]);
		}
	} else if (testOutput.Count() > expectedOutput.Count()) {
		Print("TEST FAILED: EXTRA OUTPUT AT LINE " + String::Format(outputLineNum + expectedOutput.Count()));
		for (long i = expectedOutput.Count(); i < testOutput.Count(); i++) {
			Print("  EXTRA: " + testOutput[i]);
		}
	}
	testOutput.Clear();
}